

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::do_move(Board *this,uint turn,Point *source,Point *destination)

{
  pointer pvVar1;
  
  pvVar1 = (this->m_board).m_data.
           super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)destination->m_y * 0x10 +
             *(long *)&pvVar1[destination->m_x].
                       super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
             ),(__shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)source->m_y * 0x10 +
               *(long *)&pvVar1[source->m_x].
                         super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
               ));
  Piece::do_move(*(Piece **)
                  (*(long *)&(this->m_board).m_data.
                             super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[destination->m_x].
                             super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                  + (long)destination->m_y * 0x10),turn,destination);
  return;
}

Assistant:

void Board::do_move(unsigned int turn, const Point &source, const Point &destination) {
    m_board[destination] = move(m_board[source]);
    m_board[destination]->do_move(turn, destination);
}